

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

int __thiscall
ddd::DictionaryMLT<false,_false>::stat(DictionaryMLT<false,_false> *this,char *__file,stat *__buf)

{
  long lVar1;
  pointer pcVar2;
  uint uVar3;
  DaTrie<false,_false,_true> *this_00;
  pointer puVar4;
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  this_01;
  pointer pBVar5;
  pointer pcVar6;
  size_t sVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  *(size_t *)__file = this->num_keys_;
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  this_00 = (this->prefix_subtrie_)._M_t.
            super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl;
  uVar3 = this_00->bc_emps_;
  pBVar5 = *(pointer *)
            ((long)&(this_00->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 0x10);
  lVar1 = *(long *)&(this_00->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>;
  auVar10._8_4_ = (int)lVar1;
  auVar10._0_8_ = lVar1;
  auVar10._12_4_ = (int)((ulong)lVar1 >> 0x20);
  uVar8 = (ulong)((long)*(pointer *)
                         ((long)&(this_00->bc_).
                                 super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 8) - lVar1)
          >> 3;
  *(ulong *)(__file + 0x10) = (ulong)((int)uVar8 - uVar3);
  *(ulong *)(__file + 0x18) = uVar8 & 0xffffffff;
  *(ulong *)(__file + 0x20) = (ulong)((long)pBVar5 - auVar10._8_8_) >> 3 & 0xffffffff;
  *(ulong *)(__file + 0x28) = (ulong)uVar3;
  pcVar6 = *(pointer *)
            ((long)&(this_00->tail_).super__Vector_base<char,_std::allocator<char>_> + 0x10);
  pcVar2 = (this_00->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar11._8_4_ = (int)pcVar2;
  auVar11._0_8_ = pcVar2;
  auVar11._12_4_ = (int)((ulong)pcVar2 >> 0x20);
  *(ulong *)(__file + 0x30) =
       (long)*(pointer *)
              ((long)&(this_00->tail_).super__Vector_base<char,_std::allocator<char>_> + 8) -
       (long)pcVar2 & 0xffffffff;
  *(ulong *)(__file + 0x38) = (long)pcVar6 - auVar11._8_8_ & 0xffffffff;
  *(ulong *)(__file + 0x40) = (ulong)this_00->tail_emps_;
  sVar7 = DaTrie<false,_false,_true>::size_in_bytes(this_00);
  *(size_t *)(__file + 0x48) = sVar7;
  for (uVar8 = 0;
      puVar4 = (this->suffix_subtries_).
               super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(this->suffix_subtries_).
                            super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3);
      uVar8 = uVar8 + 1) {
    this_01._M_t.
    super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
    .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl =
         puVar4[uVar8]._M_t.
         super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
         ._M_t;
    if ((_Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
         )this_01._M_t.
          super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
          .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl !=
        (DaTrie<false,_false,_false> *)0x0) {
      uVar3 = *(uint32_t *)
               ((long)this_01._M_t.
                      super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                      .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl
               + 100);
      pBVar5 = *(pointer *)
                ((long)this_01._M_t.
                       super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                       .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                       _M_head_impl + 0x10);
      lVar1 = *(long *)this_01._M_t.
                       super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                       .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                       _M_head_impl;
      auVar12._8_4_ = (int)lVar1;
      auVar12._0_8_ = lVar1;
      auVar12._12_4_ = (int)((ulong)lVar1 >> 0x20);
      uVar9 = (ulong)((long)*(pointer *)
                             ((long)this_01._M_t.
                                    super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                    .
                                    super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                    ._M_head_impl + 8) - lVar1) >> 3;
      *(ulong *)(__file + 0x10) = *(long *)(__file + 0x10) + (ulong)((int)uVar9 - uVar3);
      *(ulong *)(__file + 0x18) = *(long *)(__file + 0x18) + (uVar9 & 0xffffffff);
      *(ulong *)(__file + 0x20) =
           *(long *)(__file + 0x20) + ((ulong)((long)pBVar5 - auVar12._8_8_) >> 3 & 0xffffffff);
      *(ulong *)(__file + 0x28) = *(long *)(__file + 0x28) + (ulong)uVar3;
      pcVar2 = *(pointer *)
                ((long)this_01._M_t.
                       super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                       .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                       _M_head_impl + 0x28);
      lVar1 = *(long *)&(((vector<char,_std::allocator<char>_> *)
                         ((long)this_01._M_t.
                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                _M_head_impl + 0x18))->
                        super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data;
      auVar13._8_4_ = (int)lVar1;
      auVar13._0_8_ = lVar1;
      auVar13._12_4_ = (int)((ulong)lVar1 >> 0x20);
      *(ulong *)(__file + 0x30) =
           ((long)*(pointer *)
                   ((long)this_01._M_t.
                          super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                          .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                          _M_head_impl + 0x20) - lVar1 & 0xffffffffU) + *(long *)(__file + 0x30);
      *(ulong *)(__file + 0x38) =
           ((long)pcVar2 - auVar13._8_8_ & 0xffffffffU) + *(long *)(__file + 0x38);
      *(ulong *)(__file + 0x40) =
           *(long *)(__file + 0x40) +
           (ulong)*(uint32_t *)
                   ((long)this_01._M_t.
                          super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                          .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                          _M_head_impl + 0x68);
      sVar7 = DaTrie<false,_false,_false>::size_in_bytes
                        ((DaTrie<false,_false,_false> *)
                         this_01._M_t.
                         super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                         .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                         _M_head_impl);
      sVar7 = sVar7 + *(long *)(__file + 0x48);
      *(long *)(__file + 8) = *(long *)(__file + 8) + 1;
    }
    sVar7 = sVar7 + 1;
    *(size_t *)(__file + 0x48) = sVar7;
  }
  *(size_t *)(__file + 0x48) = sVar7 + 0x14;
  return (int)(sVar7 + 0x14);
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = prefix_subtrie_->num_nodes();
    ret.bc_size = prefix_subtrie_->bc_size();
    ret.bc_capa = prefix_subtrie_->bc_capa();
    ret.bc_emps = prefix_subtrie_->bc_emps();
    ret.tail_size = prefix_subtrie_->tail_size();
    ret.tail_capa = prefix_subtrie_->tail_capa();
    ret.tail_emps = prefix_subtrie_->tail_emps();
    ret.size_in_bytes = prefix_subtrie_->size_in_bytes();

    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      auto& subtrie = suffix_subtries_[i];
      if (subtrie) {
        ret.num_nodes += subtrie->num_nodes();
        ret.bc_size += subtrie->bc_size();
        ret.bc_capa += subtrie->bc_capa();
        ret.bc_emps += subtrie->bc_emps();
        ret.tail_size += subtrie->tail_size();
        ret.tail_capa += subtrie->tail_capa();
        ret.tail_emps += subtrie->tail_emps();
        ret.size_in_bytes += subtrie->size_in_bytes();
        ++ret.num_tries;
      }
      ret.size_in_bytes += sizeof(bool);
    }

    ret.size_in_bytes += sizeof(suffix_subtries_.size());
    ret.size_in_bytes += sizeof(suffix_head_);
    ret.size_in_bytes += sizeof(num_keys_);
  }